

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O2

Url * __thiscall
Vault::Client::getUrl(Url *__return_storage_ptr__,Client *this,string *base,Path *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  string = "http://";
  if (this->tls_ != false) {
    string = "https://";
  }
  Vault::operator+(&local_48,string,&this->host_);
  std::operator+(&bStack_c8,&local_48,":");
  Vault::operator+(&local_a8,&bStack_c8,&this->port_);
  std::operator+(&local_88,&local_a8,base);
  Vault::operator+(&local_68,&local_88,path);
  paVar1 = &(__return_storage_ptr__->value_).field_2;
  (__return_storage_ptr__->value_)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->value_).field_2 + 8) = local_68.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->value_)._M_dataplus._M_p = local_68._M_dataplus._M_p;
    (__return_storage_ptr__->value_).field_2._M_allocated_capacity =
         CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->value_)._M_string_length = local_68._M_string_length;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&bStack_c8);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Client::getUrl(const std::string &base,
                                 const Vault::Path &path) const {
  return Vault::Url{(tls_ ? "https://" : "http://") + host_ + ":" + port_ +
                    base + path};
}